

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateSimpleNodeAnim
          (FBXConverter *this,string *name,Model *target,const_iterator *chain,
          const_iterator iter_end,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,
          double *min_time,bool reverse_order)

{
  pointer *pptVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  aiVectorKey *paVar6;
  aiVectorKey *out_quat_00;
  vector<long,_std::allocator<long>_> *times_00;
  bool bVar7;
  RotOrder RVar8;
  aiNodeAnim *this_00;
  pointer paVar9;
  PropertyTable *pPVar10;
  reference ppVar11;
  size_type sVar12;
  ulong uVar13;
  aiVectorKey *paVar14;
  aiQuatKey *paVar15;
  aiQuaternion aVar16;
  aiVector3t<float> aVar17;
  aiVectorKey *local_6b0;
  float local_668;
  float fStack_664;
  aiQuatKey *local_628;
  aiVectorKey *local_5a0;
  aiVectorKey *local_510;
  aiVectorKey *local_4e8;
  aiQuatKey *local_4c0;
  aiVector3t<float> local_3a0;
  allocator local_391;
  string local_390;
  undefined8 local_36c;
  float local_364;
  float local_360;
  float fStack_35c;
  float local_358;
  aiVector3t<float> local_350;
  allocator local_341;
  string local_340;
  aiVector3D local_320;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  float local_2f8;
  aiVector3t<float> local_2f0;
  allocator local_2e1;
  string local_2e0;
  undefined8 local_2bc;
  float local_2b4;
  aiVectorKey *local_2b0;
  aiVectorKey *out_translation;
  aiVectorKey *out_scale;
  aiQuatKey *out_quat;
  vector<long,_std::allocator<long>_> *local_280;
  KeyTimeList *times;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  *local_270;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_268;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_260;
  const_iterator local_258;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  *local_250;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  *local_248;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_240;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_238;
  const_iterator local_230;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  *local_228;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  *local_220;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_218;
  __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
  local_210;
  const_iterator local_208;
  undefined1 local_200 [8];
  KeyFrameListList joined;
  KeyFrameListList local_1d0;
  KeyFrameListList local_1b8;
  undefined1 local_1a0 [8];
  KeyFrameListList rotation;
  KeyFrameListList translation;
  KeyFrameListList scaling;
  aiVector3t<float> local_148;
  allocator local_139;
  string local_138;
  undefined1 local_114 [8];
  aiVector3D def_rot;
  aiVector3t<float> local_f8;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  aiVector3D def_translate;
  aiVector3t<float> local_a8;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  aiVector3D def_scale;
  PropertyTable *props;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> local_50;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  bool reverse_order_local;
  LayerMap *layer_map_local;
  const_iterator *chain_local;
  Model *target_local;
  string *name_local;
  FBXConverter *this_local;
  const_iterator iter_end_local;
  
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl._7_1_ = reverse_order;
  this_local = (FBXConverter *)iter_end._M_node;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this_00);
  std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>::
  unique_ptr<std::default_delete<aiNodeAnim>,void>
            ((unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>> *)&local_50,this_00);
  paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
  aiString::Set(&paVar9->mNodeName,name);
  pPVar10 = Model::Props(target);
  unique0x10001715 = pPVar10;
  if ((na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    bVar7 = std::operator!=(chain + 0xc,(_Self *)&this_local);
    if (bVar7) {
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_50);
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 0xc);
      ConvertScaleKeys(this,paVar9,&ppVar11->second,layer_map,start,stop,max_time,min_time);
    }
    else {
      paVar14 = (aiVectorKey *)operator_new__(0x18);
      local_5a0 = paVar14;
      do {
        aiVectorKey::aiVectorKey(local_5a0);
        local_5a0 = local_5a0 + 1;
      } while (local_5a0 != paVar14 + 1);
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mScalingKeys = paVar14;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mNumScalingKeys = 1;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      pPVar10 = stack0xffffffffffffff98;
      paVar9->mScalingKeys->mTime = 0.0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e0,"Lcl Scaling",&local_2e1);
      aiVector3t<float>::aiVector3t(&local_2f0,1.0,1.0,1.0);
      aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_2e0,&local_2f0);
      local_2f8 = aVar17.z;
      local_300 = aVar17._0_8_;
      local_2bc = local_300;
      local_2b4 = local_2f8;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar14 = paVar9->mScalingKeys;
      (paVar14->mValue).x = (float)(undefined4)local_2bc;
      (paVar14->mValue).y = (float)local_2bc._4_4_;
      (paVar14->mValue).z = local_2b4;
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    }
    bVar7 = std::operator!=(chain + 7,(_Self *)&this_local);
    if (bVar7) {
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_50);
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 7);
      RVar8 = Model::RotationOrder(target);
      ConvertRotationKeys(this,paVar9,&ppVar11->second,layer_map,start,stop,max_time,min_time,RVar8)
      ;
    }
    else {
      paVar15 = (aiQuatKey *)operator_new__(0x18);
      local_628 = paVar15;
      do {
        aiQuatKey::aiQuatKey(local_628);
        local_628 = local_628 + 1;
      } while (local_628 != paVar15 + 1);
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mRotationKeys = paVar15;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mNumRotationKeys = 1;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      pPVar10 = stack0xffffffffffffff98;
      paVar9->mRotationKeys->mTime = 0.0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"Lcl Rotation",&local_341);
      aiVector3t<float>::aiVector3t(&local_350,0.0,0.0,0.0);
      aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_340,&local_350);
      local_358 = aVar17.z;
      local_320._0_8_ = aVar17._0_8_;
      local_668 = aVar17.x;
      fStack_664 = aVar17.y;
      local_360 = local_668;
      fStack_35c = fStack_664;
      local_320.z = local_358;
      RVar8 = Model::RotationOrder(target);
      aVar16 = EulerToQuaternion(this,&local_320,RVar8);
      local_308 = aVar16._8_8_;
      local_310 = aVar16._0_8_;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar15 = paVar9->mRotationKeys;
      (paVar15->mValue).w = (float)(undefined4)local_310;
      (paVar15->mValue).x = (float)local_310._4_4_;
      (paVar15->mValue).y = (float)(undefined4)local_308;
      (paVar15->mValue).z = (float)local_308._4_4_;
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
    }
    bVar7 = std::operator!=(chain + 3,(_Self *)&this_local);
    if (bVar7) {
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_50);
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 3);
      ConvertTranslationKeys(this,paVar9,&ppVar11->second,layer_map,start,stop,max_time,min_time);
    }
    else {
      paVar14 = (aiVectorKey *)operator_new__(0x18);
      local_6b0 = paVar14;
      do {
        aiVectorKey::aiVectorKey(local_6b0);
        local_6b0 = local_6b0 + 1;
      } while (local_6b0 != paVar14 + 1);
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mPositionKeys = paVar14;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar9->mNumPositionKeys = 1;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      pPVar10 = stack0xffffffffffffff98;
      paVar9->mPositionKeys->mTime = 0.0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"Lcl Translation",&local_391);
      aiVector3t<float>::aiVector3t(&local_3a0,0.0,0.0,0.0);
      aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_390,&local_3a0);
      local_364 = aVar17.z;
      local_36c = aVar17._0_8_;
      paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
      paVar14 = paVar9->mPositionKeys;
      (paVar14->mValue).x = (float)(undefined4)local_36c;
      (paVar14->mValue).y = (float)local_36c._4_4_;
      (paVar14->mValue).z = local_364;
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"Lcl Scaling",&local_99);
    aiVector3t<float>::aiVector3t(&local_a8,1.0,1.0,1.0);
    aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_98,&local_a8);
    def_scale.x = aVar17.z;
    unique0x100005b6 = aVar17._0_8_;
    local_78 = (undefined1  [8])unique0x100005b6;
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pPVar10 = stack0xffffffffffffff98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"Lcl Translation",&local_e9);
    aiVector3t<float>::aiVector3t(&local_f8,0.0,0.0,0.0);
    aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_e8,&local_f8);
    def_translate.x = aVar17.z;
    def_rot._4_8_ = aVar17._0_8_;
    local_c8 = (undefined1  [8])def_rot._4_8_;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    pPVar10 = stack0xffffffffffffff98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"Lcl Rotation",&local_139);
    aiVector3t<float>::aiVector3t(&local_148,0.0,0.0,0.0);
    aVar17 = PropertyGet<aiVector3t<float>>(pPVar10,&local_138,&local_148);
    def_rot.x = aVar17.z;
    local_114 = aVar17._0_8_;
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              *)&translation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              *)&rotation.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              *)local_1a0);
    bVar7 = std::operator!=(chain + 0xc,(_Self *)&this_local);
    if (bVar7) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 0xc);
      GetKeyframeList(&local_1b8,this,&ppVar11->second,start,stop);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::operator=((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&translation.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b8);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&local_1b8);
    }
    bVar7 = std::operator!=(chain + 3,(_Self *)&this_local);
    if (bVar7) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 3);
      GetKeyframeList(&local_1d0,this,&ppVar11->second,start,stop);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::operator=((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&rotation.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d0);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&local_1d0);
    }
    bVar7 = std::operator!=(chain + 7,(_Self *)&this_local);
    if (bVar7) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                ::operator*(chain + 7);
      GetKeyframeList((KeyFrameListList *)
                      &joined.
                       super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&ppVar11->second,
                      start,stop);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::operator=((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)local_1a0,
                  (vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)&joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&joined.
                    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              *)local_200);
    local_210._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)local_200);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
    ::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*>
              ((__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
                *)&local_208,&local_210);
    pptVar1 = &translation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_218._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::begin((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                     *)pptVar1);
    local_220 = (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                 *)std::
                   vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          *)pptVar1);
    local_228 = (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                 *)std::
                   vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                   ::
                   insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
                             ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                               *)local_200,local_208,local_218,
                              (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                               )local_220);
    local_238._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)local_200);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
    ::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*>
              ((__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
                *)&local_230,&local_238);
    pptVar1 = &rotation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_240._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::begin((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                     *)pptVar1);
    local_248 = (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                 *)std::
                   vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          *)pptVar1);
    local_250 = (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                 *)std::
                   vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                   ::
                   insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
                             ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                               *)local_200,local_230,local_240,
                              (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                               )local_248);
    local_260._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   *)local_200);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
    ::
    __normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*>
              ((__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>const*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>
                *)&local_258,&local_260);
    local_268._M_current =
         (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
          *)std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::begin((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                     *)local_1a0);
    local_270 = (tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                 *)std::
                   vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                   ::end((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          *)local_1a0);
    times = (KeyTimeList *)
            std::
            vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
            ::
            insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>,void>
                      ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                        *)local_200,local_258,local_268,
                       (__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_*,_std::vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>_>
                        )local_270);
    GetKeyTimeList((KeyTimeList *)&out_quat,this,(KeyFrameListList *)local_200);
    local_280 = (vector<long,_std::allocator<long>_> *)&out_quat;
    sVar12 = std::vector<long,_std::allocator<long>_>::size(local_280);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar12;
    uVar13 = SUB168(auVar3 * ZEXT816(0x18),0);
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    out_scale = (aiVectorKey *)operator_new__(uVar13);
    if (sVar12 != 0) {
      local_4c0 = (aiQuatKey *)out_scale;
      do {
        aiQuatKey::aiQuatKey(local_4c0);
        local_4c0 = local_4c0 + 1;
      } while (local_4c0 != (aiQuatKey *)out_scale + sVar12);
    }
    sVar12 = std::vector<long,_std::allocator<long>_>::size(local_280);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar12;
    uVar13 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    out_translation = (aiVectorKey *)operator_new__(uVar13);
    if (sVar12 != 0) {
      local_4e8 = out_translation;
      do {
        aiVectorKey::aiVectorKey(local_4e8);
        local_4e8 = local_4e8 + 1;
      } while (local_4e8 != out_translation + sVar12);
    }
    sVar12 = std::vector<long,_std::allocator<long>_>::size(local_280);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = sVar12;
    uVar13 = SUB168(auVar5 * ZEXT816(0x18),0);
    if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    local_2b0 = (aiVectorKey *)operator_new__(uVar13);
    if (sVar12 != 0) {
      local_510 = local_2b0;
      do {
        aiVectorKey::aiVectorKey(local_510);
        local_510 = local_510 + 1;
      } while (local_510 != local_2b0 + sVar12);
    }
    sVar12 = std::vector<long,_std::allocator<long>_>::size(local_280);
    times_00 = local_280;
    out_quat_00 = out_scale;
    paVar6 = out_translation;
    paVar14 = local_2b0;
    if (sVar12 != 0) {
      RVar8 = Model::RotationOrder(target);
      ConvertTransformOrder_TRStoSRT
                (this,(aiQuatKey *)out_quat_00,paVar6,paVar14,
                 (KeyFrameListList *)
                 &translation.
                  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (KeyFrameListList *)
                 &rotation.
                  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(KeyFrameListList *)local_1a0,
                 times_00,max_time,min_time,RVar8,(aiVector3D *)local_78,(aiVector3D *)local_c8,
                 (aiVector3D *)local_114);
    }
    sVar12 = std::vector<long,_std::allocator<long>_>::size(local_280);
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar9->mNumScalingKeys = (uint)sVar12;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    uVar2 = paVar9->mNumScalingKeys;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar9->mNumRotationKeys = uVar2;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    uVar2 = paVar9->mNumScalingKeys;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar14 = out_translation;
    paVar9->mNumPositionKeys = uVar2;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar6 = out_scale;
    paVar9->mScalingKeys = paVar14;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar14 = local_2b0;
    paVar9->mRotationKeys = (aiQuatKey *)paVar6;
    paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_50);
    paVar9->mPositionKeys = paVar14;
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)&out_quat);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)local_200);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)local_1a0);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)&rotation.
                  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)&translation.
                  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  paVar9 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::release(&local_50);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&local_50);
  return paVar9;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateSimpleNodeAnim(const std::string& name,
            const Model& target,
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM],
            NodeMap::const_iterator iter_end,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool reverse_order)

        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            const PropertyTable& props = target.Props();

            // need to convert from TRS order to SRT?
            if (reverse_order) {

                aiVector3D def_scale = PropertyGet(props, "Lcl Scaling", aiVector3D(1.f, 1.f, 1.f));
                aiVector3D def_translate = PropertyGet(props, "Lcl Translation", aiVector3D(0.f, 0.f, 0.f));
                aiVector3D def_rot = PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f));

                KeyFrameListList scaling;
                KeyFrameListList translation;
                KeyFrameListList rotation;

                if (chain[TransformationComp_Scaling] != iter_end) {
                    scaling = GetKeyframeList((*chain[TransformationComp_Scaling]).second, start, stop);
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    translation = GetKeyframeList((*chain[TransformationComp_Translation]).second, start, stop);
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    rotation = GetKeyframeList((*chain[TransformationComp_Rotation]).second, start, stop);
                }

                KeyFrameListList joined;
                joined.insert(joined.end(), scaling.begin(), scaling.end());
                joined.insert(joined.end(), translation.begin(), translation.end());
                joined.insert(joined.end(), rotation.begin(), rotation.end());

                const KeyTimeList& times = GetKeyTimeList(joined);

                aiQuatKey* out_quat = new aiQuatKey[times.size()];
                aiVectorKey* out_scale = new aiVectorKey[times.size()];
                aiVectorKey* out_translation = new aiVectorKey[times.size()];

                if (times.size())
                {
                    ConvertTransformOrder_TRStoSRT(out_quat, out_scale, out_translation,
                        scaling,
                        translation,
                        rotation,
                        times,
                        max_time,
                        min_time,
                        target.RotationOrder(),
                        def_scale,
                        def_translate,
                        def_rot);
                }

                // XXX remove duplicates / redundant keys which this operation did
                // likely produce if not all three channels were equally dense.

                na->mNumScalingKeys = static_cast<unsigned int>(times.size());
                na->mNumRotationKeys = na->mNumScalingKeys;
                na->mNumPositionKeys = na->mNumScalingKeys;

                na->mScalingKeys = out_scale;
                na->mRotationKeys = out_quat;
                na->mPositionKeys = out_translation;
            }
            else {

                // if a particular transformation is not given, grab it from
                // the corresponding node to meet the semantics of aiNodeAnim,
                // which requires all of rotation, scaling and translation
                // to be set.
                if (chain[TransformationComp_Scaling] != iter_end) {
                    ConvertScaleKeys(na.get(), (*chain[TransformationComp_Scaling]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mScalingKeys = new aiVectorKey[1];
                    na->mNumScalingKeys = 1;

                    na->mScalingKeys[0].mTime = 0.;
                    na->mScalingKeys[0].mValue = PropertyGet(props, "Lcl Scaling",
                        aiVector3D(1.f, 1.f, 1.f));
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    ConvertRotationKeys(na.get(), (*chain[TransformationComp_Rotation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time,
                        target.RotationOrder());
                }
                else {
                    na->mRotationKeys = new aiQuatKey[1];
                    na->mNumRotationKeys = 1;

                    na->mRotationKeys[0].mTime = 0.;
                    na->mRotationKeys[0].mValue = EulerToQuaternion(
                        PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f)),
                        target.RotationOrder());
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    ConvertTranslationKeys(na.get(), (*chain[TransformationComp_Translation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mPositionKeys = new aiVectorKey[1];
                    na->mNumPositionKeys = 1;

                    na->mPositionKeys[0].mTime = 0.;
                    na->mPositionKeys[0].mValue = PropertyGet(props, "Lcl Translation",
                        aiVector3D(0.f, 0.f, 0.f));
                }

            }
            return na.release();
        }